

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

TimerHolder __thiscall
Liby::TimerQueue::insert(TimerQueue *this,Timestamp *timeout,BasicHandler *handler)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TimerHolder TVar1;
  WeakTimerHolder weak_holder;
  WeakTimerHolder local_60;
  
  std::make_shared<Liby::Timer,Liby::Timestamp_const&,std::function<void()>const&>
            ((Timestamp *)this,handler);
  WeakTimerHolder::WeakTimerHolder(&local_60,(TimerHolder *)this);
  if ((int)timeout[2].tv_.tv_usec == 0) {
    updateTimerfd((TimerQueue *)timeout,(Timestamp *)handler);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert
            ((BinaryHeap<Liby::WeakTimerHolder> *)&timeout[2].tv_.tv_usec,&local_60);
  WeakTimerHolder::~WeakTimerHolder(&local_60);
  TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder TimerQueue::insert(const Timestamp &timeout,
                               const BasicHandler &handler) {
    TimerHolder holder(timeout, handler);
    WeakTimerHolder weak_holder(holder);

    if (queue_.empty()) {
        updateTimerfd(timeout);
    }

    queue_.insert(weak_holder);
    return holder;
}